

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O1

char * __thiscall
testing::internal::TypedTestSuitePState::VerifyRegisteredTestNames
          (TypedTestSuitePState *this,char *test_suite_name,char *file,int line,
          char *registered_tests)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Base_ptr __n;
  _Alloc_hider _Var4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  _Alloc_hider _Var9;
  const_iterator cVar10;
  _Rb_tree_node_base *p_Var11;
  undefined8 extraout_RAX;
  int line_00;
  ulong uVar12;
  char *__s;
  ostream *poVar13;
  string *name;
  pointer __k;
  char *pcVar14;
  _Rb_tree_node_base *p_Var15;
  Message errors;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_vec;
  string local_110;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  TypedTestSuitePState *local_e8;
  uint local_dc;
  undefined1 local_d8 [32];
  _Base_ptr local_b8;
  size_t local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  char *local_88;
  internal *local_80;
  CodeLocation local_78;
  string local_50;
  
  line_00 = line;
  local_88 = registered_tests;
  std::__cxx11::string::string((string *)local_d8,file,(allocator *)&local_110);
  paVar1 = &local_78.file.field_2;
  local_78.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_d8._0_8_,(char *)(local_d8._0_8_ + local_d8._8_8_));
  local_78.line = line;
  RegisterTypeParameterizedTestSuite(test_suite_name,&local_78);
  local_dc = line;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.file._M_dataplus._M_p,local_78.file.field_2._M_allocated_capacity + 1);
  }
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_d8 + 0x10);
  local_80 = (internal *)file;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._0_8_ != paVar1) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  *this = (TypedTestSuitePState)0x1;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = local_88 + -1;
  local_e8 = this;
  do {
    pbVar2 = (byte *)(__s + 1);
    __s = __s + 1;
    iVar6 = isspace((uint)*pbVar2);
  } while (iVar6 != 0);
  do {
    pcVar7 = strchr(__s,0x2c);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    if (pcVar7 == (char *)0x0) {
      sVar8 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,__s,__s + sVar8);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,__s,pcVar7);
    }
    _Var9._M_p = local_110._M_dataplus._M_p;
    if (local_110._M_string_length != 0) {
      pcVar7 = local_110._M_dataplus._M_p + local_110._M_string_length;
      do {
        _Var4._M_p = local_110._M_dataplus._M_p;
        iVar6 = isspace((uint)(byte)pcVar7[-1]);
        _Var9._M_p = _Var4._M_p;
        if (iVar6 == 0) break;
        pcVar14 = pcVar7 + -1;
        uVar12 = (long)pcVar14 - (long)_Var4._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_110,uVar12);
        pcVar7 = local_110._M_dataplus._M_p + uVar12;
        _Var9._M_p = local_110._M_dataplus._M_p;
      } while (pcVar14 != _Var4._M_p);
    }
    paVar3 = &local_110.field_2;
    local_d8._0_8_ = _Var9._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p == paVar3) {
      local_d8._24_8_ = local_110.field_2._8_8_;
      local_d8._0_8_ = paVar1;
    }
    local_d8._17_7_ = local_110.field_2._M_allocated_capacity._1_7_;
    local_d8[0x10] = local_110.field_2._M_local_buf[0];
    local_d8._8_8_ = local_110._M_string_length;
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    local_110._M_dataplus._M_p = (pointer)paVar3;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._0_8_ != paVar1) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
    __s = strchr(__s,0x2c);
    if (__s == (char *)0x0) {
      __s = (char *)0x0;
    }
    else {
      do {
        pbVar2 = (byte *)(__s + 1);
        __s = __s + 1;
        iVar6 = isspace((uint)*pbVar2);
      } while (iVar6 != 0);
    }
  } while (__s != (char *)0x0);
  Message::Message((Message *)&local_f0);
  local_d8._24_8_ = local_d8 + 8;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffff00000000;
  local_d8._16_8_ = 0;
  local_b0 = 0;
  local_b8 = (_Base_ptr)local_d8._24_8_;
  if (local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar13 = (ostream *)(local_f0._M_head_impl + 0x10);
    p_Var11 = (_Rb_tree_node_base *)(local_e8 + 0x10);
    __k = local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_d8,__k);
      if (cVar10._M_node == (_Base_ptr)(local_d8 + 8)) {
        p_Var15 = *(_Rb_tree_node_base **)(local_e8 + 0x20);
        if (p_Var15 != p_Var11) {
          __n = (_Base_ptr)__k->_M_string_length;
          do {
            if ((__n == p_Var15[1]._M_parent) &&
               ((__n == (_Base_ptr)0x0 ||
                (iVar6 = bcmp((__k->_M_dataplus)._M_p,*(void **)(p_Var15 + 1),(size_t)__n),
                iVar6 == 0)))) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_d8,__k);
              goto LAB_0013007e;
            }
            p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
          } while (p_Var15 != p_Var11);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"No test named ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,(__k->_M_dataplus)._M_p,__k->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13," can be found in this test suite.\n",0x22);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"Test ",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,(__k->_M_dataplus)._M_p,__k->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13," is listed more than once.\n",0x1b);
      }
LAB_0013007e:
      __k = __k + 1;
    } while (__k != local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var11 = *(_Rb_tree_node_base **)(local_e8 + 0x20);
  p_Var15 = (_Rb_tree_node_base *)(local_e8 + 0x10);
  if (p_Var11 != p_Var15) {
    do {
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_d8,(key_type *)(p_Var11 + 1));
      if (cVar10._M_node == (_Base_ptr)(local_d8 + 8)) {
        poVar13 = (ostream *)(local_f0._M_head_impl + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"You forgot to list test ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,".\n",2);
      }
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    } while (p_Var11 != p_Var15);
  }
  _Var5._M_head_impl = local_f0._M_head_impl;
  StringStreamToString(&local_110,local_f0._M_head_impl);
  iVar6 = std::__cxx11::string::compare((char *)&local_110);
  if (iVar6 != 0) {
    FormatFileLocation_abi_cxx11_(&local_50,local_80,(char *)(ulong)local_dc,line_00);
    VerifyRegisteredTestNames();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d8);
    if (local_f0._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_f0._M_head_impl + 8))();
    }
    local_f0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    _Unwind_Resume(extraout_RAX);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d8);
  if (_Var5._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)_Var5._M_head_impl + 8))(_Var5._M_head_impl);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return local_88;
}

Assistant:

const char* TypedTestSuitePState::VerifyRegisteredTestNames(
    const char* test_suite_name, const char* file, int line,
    const char* registered_tests) {
  RegisterTypeParameterizedTestSuite(test_suite_name, CodeLocation(file, line));

  typedef RegisteredTestsMap::const_iterator RegisteredTestIter;
  registered_ = true;

  std::vector<std::string> name_vec = SplitIntoTestNames(registered_tests);

  Message errors;

  std::set<std::string> tests;
  for (std::vector<std::string>::const_iterator name_it = name_vec.begin();
       name_it != name_vec.end(); ++name_it) {
    const std::string& name = *name_it;
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (RegisteredTestIter it = registered_tests_.begin();
         it != registered_tests_.end();
         ++it) {
      if (name == it->first) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test suite.\n";
    }
  }

  for (RegisteredTestIter it = registered_tests_.begin();
       it != registered_tests_.end();
       ++it) {
    if (tests.count(it->first) == 0) {
      errors << "You forgot to list test " << it->first << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}